

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexMaterialArray.cpp
# Opt level: O1

void __thiscall
btTriangleIndexVertexMaterialArray::btTriangleIndexVertexMaterialArray
          (btTriangleIndexVertexMaterialArray *this,int numTriangles,int *triangleIndexBase,
          int triangleIndexStride,int numVertices,btScalar *vertexBase,int vertexStride,
          int numMaterials,uchar *materialBase,int materialStride,int *triangleMaterialsBase,
          int materialIndexStride)

{
  btMaterialProperties local_60;
  
  btTriangleIndexVertexArray::btTriangleIndexVertexArray
            (&this->super_btTriangleIndexVertexArray,numTriangles,triangleIndexBase,
             triangleIndexStride,numVertices,vertexBase,vertexStride);
  (this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.
  _vptr_btStridingMeshInterface = (_func_int **)&PTR__btTriangleIndexVertexMaterialArray_00226d10;
  (this->m_materials).m_ownsMemory = true;
  (this->m_materials).m_data = (btMaterialProperties *)0x0;
  (this->m_materials).m_size = 0;
  (this->m_materials).m_capacity = 0;
  local_60.m_numMaterials = numMaterials;
  local_60.m_materialBase = materialBase;
  local_60.m_materialStride = materialStride;
  local_60.m_materialType = PHY_FLOAT;
  local_60.m_triangleMaterialsBase = (uchar *)triangleMaterialsBase;
  local_60.m_triangleMaterialStride = materialIndexStride;
  local_60.m_triangleType = PHY_INTEGER;
  local_60.m_numTriangles = numTriangles;
  addMaterialProperties(this,&local_60,PHY_INTEGER);
  return;
}

Assistant:

btTriangleIndexVertexMaterialArray::btTriangleIndexVertexMaterialArray(int numTriangles,int* triangleIndexBase,int triangleIndexStride,
                                   int numVertices,btScalar* vertexBase,int vertexStride,
                                   int numMaterials, unsigned char* materialBase, int materialStride,
                                   int* triangleMaterialsBase, int materialIndexStride) :
btTriangleIndexVertexArray(numTriangles, triangleIndexBase, triangleIndexStride, numVertices, vertexBase, vertexStride)
{
    btMaterialProperties mat;

    mat.m_numMaterials = numMaterials;
    mat.m_materialBase = materialBase;
    mat.m_materialStride = materialStride;
#ifdef BT_USE_DOUBLE_PRECISION
    mat.m_materialType = PHY_DOUBLE;
#else
    mat.m_materialType = PHY_FLOAT;
#endif

    mat.m_numTriangles = numTriangles;
    mat.m_triangleMaterialsBase = (unsigned char *)triangleMaterialsBase;
    mat.m_triangleMaterialStride = materialIndexStride;
    mat.m_triangleType = PHY_INTEGER;

    addMaterialProperties(mat);
}